

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O2

void form_local_comm(int orig_num_sends,int *orig_send_procs,int *orig_send_ptr,
                    int *orig_send_indices,vector<int,_std::allocator<int>_> *nodes_to_local,
                    comm_data *send_data,comm_data *recv_data,comm_data *param_8,
                    vector<int,_std::allocator<int>_> *recv_idx_nodes,MPI_Comm mpi_comm,
                    topo_data *topo_info,int tag)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  size_type __new_size;
  int local_num_procs;
  int size;
  allocator_type local_159;
  int *local_158;
  vector<int,_std::allocator<int>_> *local_150;
  pointer local_148;
  int local_rank;
  vector<int,_std::allocator<int>_> send_sizes;
  vector<int,_std::allocator<int>_> recv_buffer;
  vector<int,_std::allocator<int>_> local_idx;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> send_requests;
  vector<int,_std::allocator<int>_> send_buffer;
  vector<int,_std::allocator<int>_> send_idx_node;
  int num_procs;
  int rank;
  vector<int,_std::allocator<int>_> orig_to_node;
  MPI_Status recv_status;
  
  local_158 = orig_send_procs;
  local_150 = nodes_to_local;
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world,&num_procs);
  MPI_Comm_rank(*(undefined8 *)(mpi_comm + 0x10),&local_rank);
  MPI_Comm_size(*(undefined8 *)(mpi_comm + 0x10),&local_num_procs);
  send_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  send_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  send_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  send_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  send_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  send_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  recv_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  recv_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  recv_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  orig_to_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  orig_to_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  orig_to_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&orig_to_node,(long)orig_num_sends);
  std::vector<int,_std::allocator<int>_>::resize(&local_idx,(long)local_num_procs);
  send_idx_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&send_sizes,(long)local_num_procs,(value_type_conflict *)&send_idx_node);
  comm_data::init_num_data(send_data,local_num_procs);
  comm_data::init_num_data(recv_data,local_num_procs);
  comm_data::init_num_data(param_8,local_num_procs);
  piVar6 = (local_150->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_148 = local_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  uVar13 = 0;
  uVar12 = (ulong)(uint)orig_num_sends;
  if (orig_num_sends < 1) {
    uVar12 = uVar13;
  }
  for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
    iVar14 = local_158[uVar13];
    size = orig_send_ptr[uVar13 + 1] - orig_send_ptr[uVar13];
    iVar7 = iVar14 / *(int *)(mpi_comm + 4);
    if (*(int *)(mpi_comm + 0xc) == iVar7) {
      orig_to_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] = -1;
      param_8->procs[param_8->num_msgs] = iVar14 % *(int *)(mpi_comm + 4);
      iVar7 = size + param_8->size_msgs;
      param_8->size_msgs = iVar7;
      iVar14 = param_8->num_msgs;
      param_8->num_msgs = iVar14 + 1;
      param_8->indptr[(long)iVar14 + 1] = iVar7;
    }
    else {
      iVar14 = piVar6[iVar7];
      if (send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar14] == 0) {
        iVar2 = send_data->num_msgs;
        local_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar14] = iVar2;
        send_data->num_msgs = iVar2 + 1;
        send_data->procs[iVar2] = iVar14;
      }
      orig_to_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] = iVar7;
      send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar14] =
           send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar14] + size;
    }
  }
  iVar14 = param_8->size_msgs;
  if ((long)iVar14 != 0) {
    uVar13 = (long)iVar14 << 2;
    if (iVar14 < 0) {
      uVar13 = 0xffffffffffffffff;
    }
    piVar8 = (int *)operator_new__(uVar13);
    param_8->indices = piVar8;
  }
  for (lVar9 = 0; lVar9 < send_data->num_msgs; lVar9 = lVar9 + 1) {
    iVar14 = send_data->procs[lVar9];
    send_data->indptr[lVar9 + 1] =
         send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[iVar14] + send_data->indptr[lVar9];
    send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar14] = 0;
  }
  iVar14 = send_data->indptr[send_data->num_msgs];
  piVar8 = (int *)(long)iVar14;
  send_data->size_msgs = iVar14;
  if (piVar8 == (int *)0x0) {
    piVar8 = (int *)0x0;
  }
  else {
    uVar13 = (long)piVar8 * 4;
    if (iVar14 < 0) {
      uVar13 = 0xffffffffffffffff;
    }
    local_158 = piVar8;
    piVar8 = (int *)operator_new__(uVar13);
    send_data->indices = piVar8;
    piVar8 = local_158;
  }
  std::vector<int,_std::allocator<int>_>::vector(&send_idx_node,(size_type)piVar8,&local_159);
  param_8->size_msgs = 0;
  local_158 = orig_to_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_148 = (local_150->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_150 = (vector<int,_std::allocator<int>_> *)
              local_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  uVar13 = 0;
  while (uVar13 != uVar12) {
    iVar14 = orig_to_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13];
    uVar1 = uVar13 + 1;
    lVar9 = (long)orig_send_ptr[uVar13];
    iVar7 = orig_send_ptr[uVar13 + 1];
    uVar13 = uVar1;
    if ((long)iVar14 == -1) {
      for (; lVar9 < iVar7; lVar9 = lVar9 + 1) {
        iVar14 = orig_send_indices[lVar9];
        iVar2 = param_8->size_msgs;
        param_8->size_msgs = iVar2 + 1;
        param_8->indices[iVar2] = iVar14;
      }
    }
    else {
      iVar2 = local_148[iVar14];
      iVar3 = local_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      for (; lVar9 < iVar7; lVar9 = lVar9 + 1) {
        iVar4 = send_data->indptr[iVar3];
        iVar5 = send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2];
        send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] = iVar5 + 1;
        lVar10 = (long)iVar4 + (long)iVar5;
        send_data->indices[lVar10] = orig_send_indices[lVar9];
        *(int *)(CONCAT44(send_idx_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          send_idx_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + lVar10 * 4) = iVar14;
      }
    }
  }
  MPI_Allreduce(1,send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,local_num_procs,&ompi_mpi_int,&ompi_mpi_op_sum,
                *(undefined8 *)(mpi_comm + 0x10));
  iVar14 = send_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[local_rank];
  __new_size = (size_type)iVar14;
  recv_data->size_msgs = iVar14;
  if (__new_size == 0) {
    __new_size = 0;
  }
  else {
    uVar12 = __new_size * 4;
    if (iVar14 < 0) {
      uVar12 = 0xffffffffffffffff;
    }
    piVar8 = (int *)operator_new__(uVar12);
    recv_data->indices = piVar8;
  }
  std::vector<int,_std::allocator<int>_>::resize(recv_idx_nodes,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&send_buffer,(long)send_data->size_msgs * 2);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::resize
            (&send_requests,(long)send_data->num_msgs);
  lVar9 = 0;
  iVar14 = 0;
  while (lVar9 < send_data->num_msgs) {
    iVar7 = send_data->procs[lVar9];
    iVar2 = send_data->indptr[lVar9 + 1];
    lVar11 = 0;
    for (lVar10 = (long)send_data->indptr[lVar9]; lVar10 < iVar2; lVar10 = lVar10 + 1) {
      send_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar14 + lVar11] = send_data->indices[lVar10];
      send_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)iVar14 + lVar11 + 1] =
           *(int *)(CONCAT44(send_idx_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             send_idx_node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) + lVar10 * 4);
      lVar11 = lVar11 + 2;
    }
    MPI_Isend(send_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + iVar14,lVar11,&ompi_mpi_int,iVar7,
              (ulong)topo_info & 0xffffffff,*(undefined8 *)(mpi_comm + 0x10),
              send_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar9);
    lVar9 = lVar9 + 1;
    iVar14 = iVar14 + (int)lVar11;
  }
  iVar14 = 0;
  while (iVar14 < recv_data->size_msgs) {
    MPI_Probe(0xffffffffffffffff,(ulong)topo_info & 0xffffffff,*(undefined8 *)(mpi_comm + 0x10),
              &recv_status);
    iVar7 = recv_status.MPI_SOURCE;
    MPI_Get_count(&recv_status,&ompi_mpi_int,&size);
    if ((ulong)((long)recv_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)recv_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) < (ulong)(long)size) {
      std::vector<int,_std::allocator<int>_>::resize(&recv_buffer,(long)size);
    }
    MPI_Recv(recv_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,size,&ompi_mpi_int,iVar7,(ulong)topo_info & 0xffffffff
             ,*(undefined8 *)(mpi_comm + 0x10),&recv_status);
    lVar9 = (long)iVar14;
    piVar6 = (recv_idx_nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar10 = 0; lVar10 < size; lVar10 = lVar10 + 2) {
      *(int *)((long)recv_data->indices + lVar10 * 2 + lVar9 * 4) =
           recv_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start[lVar10];
      *(int *)((long)piVar6 + lVar10 * 2 + lVar9 * 4) =
           recv_buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start[lVar10 + 1];
      iVar14 = iVar14 + 1;
    }
    recv_data->procs[recv_data->num_msgs] = iVar7;
    recv_data->indptr[(long)recv_data->num_msgs + 1] =
         size / 2 + recv_data->indptr[recv_data->num_msgs];
    recv_data->num_msgs = recv_data->num_msgs + 1;
  }
  if (send_data->num_msgs != 0) {
    MPI_Waitall(send_data->num_msgs,
                send_requests.
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start,0);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&send_idx_node.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_idx.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&orig_to_node.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&recv_buffer.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&send_sizes.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~_Vector_base
            (&send_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&send_buffer.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

static void form_local_comm(const int orig_num_sends, const int* orig_send_procs,
        const int* orig_send_ptr, const int* orig_send_indices,
        const std::vector<int>& nodes_to_local, comm_data* send_data,
        comm_data* recv_data, comm_data* local_data,
        std::vector<int>& recv_idx_nodes, MPI_Comm mpi_comm,
        topo_data* topo_info, const int tag)
{
    // MPI_Information
    int rank, num_procs;
    int local_rank, local_num_procs;
    MPI_Comm_rank(mpi_comm, &rank);
    MPI_Comm_size(mpi_comm, &num_procs);
    MPI_Comm& local_comm = topo_info->local_comm;
    MPI_Comm_rank(local_comm, &local_rank);
    MPI_Comm_size(local_comm, &local_num_procs);

    // Declare variables
    int global_proc, local_proc;
    int size, ctr, start_ctr;
    int start, end, node;
    int idx, proc_idx;
    int proc;
    MPI_Status recv_status;

    std::vector<int> send_buffer;
    std::vector<MPI_Request> send_requests;
    std::vector<int> send_sizes;
    std::vector<int> recv_buffer;

    std::vector<int> orig_to_node;
    std::vector<int> local_idx;

    // Initialize variables
    orig_to_node.resize(orig_num_sends);
    local_idx.resize(local_num_procs);
    send_sizes.resize(local_num_procs, 0);

    send_data->init_num_data(local_num_procs);
    recv_data->init_num_data(local_num_procs);
    local_data->init_num_data(local_num_procs);

    // Form local_S_comm
    for (int i = 0; i < orig_num_sends; i++)
    {
        global_proc = orig_send_procs[i];
        size = orig_send_ptr[i+1] - orig_send_ptr[i];
        node = get_node(global_proc, topo_info);
        if (topo_info->rank_node != node)
        {
            local_proc = nodes_to_local[node];
            if (send_sizes[local_proc] == 0)
            {
                local_idx[local_proc] = send_data->num_msgs;
                send_data->procs[send_data->num_msgs++] = local_proc;
            }
            orig_to_node[i] = node;
            send_sizes[local_proc] += size;
        }
        else
        {
            orig_to_node[i] = -1;
            local_data->procs[local_data->num_msgs] = get_local_proc(global_proc, topo_info);
            local_data->size_msgs += size;
            local_data->num_msgs++;
            local_data->indptr[local_data->num_msgs] = local_data->size_msgs;
        }
    }
    if (local_data->size_msgs)
        local_data->indices = new int[local_data->size_msgs];

    for (int i = 0; i < send_data->num_msgs; i++)
    {
        local_proc = send_data->procs[i];
        send_data->indptr[i+1] = send_data->indptr[i] + send_sizes[local_proc];
        send_sizes[local_proc] = 0;
    }
    send_data->size_msgs = send_data->indptr[send_data->num_msgs];

    // Allocate send_indices and fill vector
    if (send_data->size_msgs)
        send_data->indices = new int[send_data->size_msgs];
    std::vector<int> send_idx_node(send_data->size_msgs);
    local_data->size_msgs = 0;
    for (int i = 0; i < orig_num_sends; i++)
    {
        node = orig_to_node[i];
        start = orig_send_ptr[i];
        end = orig_send_ptr[i+1];
        if (node == -1)
        {
            for (int j = start; j < end; j++)
            {
                local_data->indices[local_data->size_msgs++] = orig_send_indices[j];
            }
        }
        else
        {
            local_proc = nodes_to_local[node];
            proc_idx = local_idx[local_proc];
            for (int j = start; j < end; j++)
            {
                idx = send_data->indptr[proc_idx] + send_sizes[local_proc]++;
                send_data->indices[idx] = orig_send_indices[j];
                send_idx_node[idx] = node;
            }
        }
    }

    // Send 'local_S_comm send' info (to form local_S recv)
    MPI_Allreduce(MPI_IN_PLACE, send_sizes.data(), local_num_procs,
            MPI_INT, MPI_SUM, local_comm);
    recv_data->size_msgs = send_sizes[local_rank];
    if (recv_data->size_msgs)
        recv_data->indices = new int[recv_data->size_msgs];
    recv_idx_nodes.resize(recv_data->size_msgs);

    send_buffer.resize(2*send_data->size_msgs);
    send_requests.resize(send_data->num_msgs);
    ctr = 0;
    start_ctr = 0;
    for (int i = 0; i < send_data->num_msgs; i++)
    {
        proc = send_data->procs[i];
        start = send_data->indptr[i];
        end = send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            send_buffer[ctr++] = send_data->indices[j];
            send_buffer[ctr++] = send_idx_node[j];
        }
        MPI_Isend(&send_buffer[start_ctr], ctr - start_ctr ,
                MPI_INT, proc, tag, local_comm, &send_requests[i]);
        start_ctr = ctr;
    }

    ctr = 0;
    while (ctr < recv_data->size_msgs)
    {
        MPI_Probe(MPI_ANY_SOURCE, tag, local_comm, &recv_status);
        proc = recv_status.MPI_SOURCE;
        MPI_Get_count(&recv_status, MPI_INT, &size);
        if (size > recv_buffer.size())
            recv_buffer.resize(size);
        MPI_Recv(recv_buffer.data(), size, MPI_INT, proc, tag, local_comm, &recv_status);
        for (int i = 0; i < size; i += 2)
        {
            recv_data->indices[ctr] = recv_buffer[i];
            recv_idx_nodes[ctr++] = recv_buffer[i+1];
        }
        recv_data->procs[recv_data->num_msgs] = proc;
        recv_data->indptr[recv_data->num_msgs + 1] = recv_data->indptr[recv_data->num_msgs] + (size / 2);
        recv_data->num_msgs++;
    }

    if (send_data->num_msgs)
    {
        MPI_Waitall(send_data->num_msgs, send_requests.data(), MPI_STATUSES_IGNORE);
    }
}